

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorAlreadyActive::deinit
          (TransformFeedbackOverflowQueryErrorAlreadyActive *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (**(code **)(lVar3 + 0x630))(0x82ed,this->m_active_query_stream_index);
    (**(code **)(lVar3 + 0x458))(1,&this->m_active_stream_overflow_query);
  }
  (**(code **)(lVar3 + 0x628))(0x82ec);
  (**(code **)(lVar3 + 0x458))(1,&this->m_active_overflow_query);
  (**(code **)(lVar3 + 0x458))(1,&this->m_query);
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		if (supportsTransformFeedback3())
		{
			gl.endQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, m_active_query_stream_index);
			gl.deleteQueries(1, &m_active_stream_overflow_query);
		}

		gl.endQuery(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB);
		gl.deleteQueries(1, &m_active_overflow_query);

		gl.deleteQueries(1, &m_query);

		TransformFeedbackOverflowQueryErrorBase::deinit();
	}